

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O2

int poptAddItem(poptContext con,poptItem newItem,int flags)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  undefined8 *puVar9;
  
  iVar7 = 1;
  if (flags == 1) {
    lVar6 = 0x2d0;
    lVar8 = 0x2c8;
  }
  else {
    if (flags != 0) {
      return 1;
    }
    lVar6 = 0x2c0;
    lVar8 = 0x2b8;
  }
  pvVar3 = realloc(*(void **)((long)&con->optionStack[0].argc + lVar8),
                   (long)*(int *)((long)&con->optionStack[0].argc + lVar6) * 0x40 + 0x40);
  if (pvVar3 != (void *)0x0) {
    *(void **)((long)&con->optionStack[0].argc + lVar8) = pvVar3;
    iVar1 = *(int *)((long)&con->optionStack[0].argc + lVar6);
    pcVar2 = (newItem->option).longName;
    if (pcVar2 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      sVar4 = strlen(pcVar2);
      pcVar5 = (char *)malloc(sVar4 + 1);
      if (pcVar5 == (char *)0x0) goto LAB_00104d25;
      strcpy(pcVar5,pcVar2);
    }
    puVar9 = (undefined8 *)((long)pvVar3 + (long)iVar1 * 0x40);
    *puVar9 = pcVar5;
    *(char *)(puVar9 + 1) = (newItem->option).shortName;
    *(uint *)((long)puVar9 + 0xc) = (newItem->option).argInfo;
    puVar9[2] = (newItem->option).arg;
    *(int *)(puVar9 + 3) = (newItem->option).val;
    pcVar2 = (newItem->option).descrip;
    if (pcVar2 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      sVar4 = strlen(pcVar2);
      pcVar5 = (char *)malloc(sVar4 + 1);
      if (pcVar5 == (char *)0x0) goto LAB_00104d25;
      strcpy(pcVar5,pcVar2);
    }
    puVar9[4] = pcVar5;
    pcVar2 = (newItem->option).argDescrip;
    iVar7 = 0;
    if (pcVar2 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      sVar4 = strlen(pcVar2);
      pcVar5 = (char *)malloc(sVar4 + 1);
      if (pcVar5 == (char *)0x0) {
LAB_00104d25:
        fwrite("virtual memory exhausted.\n",0x1a,1,_stderr);
        exit(1);
      }
      strcpy(pcVar5,pcVar2);
    }
    puVar9[5] = pcVar5;
    *(int *)(puVar9 + 6) = newItem->argc;
    puVar9[7] = newItem->argv;
    *(int *)((long)&con->optionStack[0].argc + lVar6) = iVar1 + 1;
  }
  return iVar7;
}

Assistant:

int poptAddItem(poptContext con, poptItem newItem, int flags)
{
    poptItem * items, item_tmp, item;
    int * nitems;

    switch (flags) {
    case 1:
	items = &con->execs;
	nitems = &con->numExecs;
	break;
    case 0:
	items = &con->aliases;
	nitems = &con->numAliases;
	break;
    default:
	return 1;
	break;
    }

    item_tmp = realloc((*items), ((*nitems) + 1) * sizeof(**items));
    if (item_tmp == NULL)
	return 1;
    *items = item_tmp;

    item = (*items) + (*nitems);

    item->option.longName =
	(newItem->option.longName ? xstrdup(newItem->option.longName) : NULL);
    item->option.shortName = newItem->option.shortName;
    item->option.argInfo = newItem->option.argInfo;
    item->option.arg = newItem->option.arg;
    item->option.val = newItem->option.val;
    item->option.descrip =
	(newItem->option.descrip ? xstrdup(newItem->option.descrip) : NULL);
    item->option.argDescrip =
       (newItem->option.argDescrip ? xstrdup(newItem->option.argDescrip) : NULL);
    item->argc = newItem->argc;
    item->argv = newItem->argv;

    (*nitems)++;

    return 0;
}